

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_PermuteExtensions_Test::TestBody(SSLTest_PermuteExtensions_Test *this)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  SSL_METHOD *pSVar5;
  SSL_CTX *pSVar6;
  int iVar7;
  char *pcVar8;
  char *in_R9;
  uint uVar9;
  pointer *__ptr;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> ech_keys;
  long lVar10;
  bool decrypt_ech;
  AssertionResult gtest_ar__2;
  bool offer_ech;
  ScopedTrace gtest_trace_9205;
  ScopedTrace gtest_trace_9202;
  AssertionResult gtest_ar;
  UniquePtr<SSL_CTX> ctx;
  AssertionResult gtest_ar_;
  vector<unsigned_short,_std::allocator<unsigned_short>_> order2;
  UniquePtr<SSL_ECH_KEYS> keys;
  bool local_d1;
  AssertHelper local_d0;
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  bool local_b3;
  ScopedTrace local_b2;
  ScopedTrace local_b1;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  char local_6c [4];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  AssertHelper local_48;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_40;
  long local_38;
  
  MakeTestECHKeys((anon_unknown_0 *)&local_40,'\x01');
  local_88[0] = local_40._M_head_impl != (SSL_ECH_KEYS *)0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40._M_head_impl == (SSL_ECH_KEYS *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_88,(AssertionResult *)0x3467d1,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23f0,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_68.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    local_6c[2] = '\0';
    local_6c[3] = '\x01';
    lVar10 = 0;
    do {
      local_b3 = (bool)local_6c[lVar10 + 2];
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_b1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x23f2,&local_b3);
      local_38 = lVar10;
      ech_keys._M_head_impl = (SSL_ECH_KEYS *)0x0;
      if (local_b3 != false) {
        ech_keys._M_head_impl = local_40._M_head_impl;
      }
      local_6c[0] = '\0';
      local_6c[1] = '\x01';
      lVar10 = 0;
      do {
        local_d1 = (bool)local_6c[lVar10];
        testing::ScopedTrace::ScopedTrace<bool>
                  (&local_b2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x23f5,&local_d1);
        if ((local_b3 != false) || (uVar9 = 5, local_d1 == false)) {
          pSVar5 = (SSL_METHOD *)TLS_method();
          local_90._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(pSVar5);
          local_88[0] = local_90._M_head_impl != (SSL_CTX *)0x0;
          pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_90._M_head_impl == (SSL_CTX *)0x0) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b0,(internal *)local_88,(AssertionResult *)0x3442d9,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x23fc,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_b0._1_7_,local_b0[0]),
                              local_a0._M_allocated_capacity + 1);
            }
            if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(*(long *)local_68.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 8))();
            }
            if (pbStack_80 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_80,pbStack_80);
            }
            uVar9 = 1;
          }
          else {
            local_78 = (pointer)0x0;
            local_88 = (undefined1  [8])0x0;
            pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            bVar2 = GetExtensionOrder(local_90._M_head_impl,
                                      (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                      local_88,ech_keys._M_head_impl,local_d1);
            local_c8.data_._0_1_ = bVar2;
            local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar2) {
LAB_001de2ec:
              bVar2 = GetExtensionOrder(local_90._M_head_impl,&local_68,ech_keys._M_head_impl,
                                        local_d1);
              local_c8.data_._0_1_ = bVar2;
              local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!bVar2) {
                testing::Message::Message((Message *)&local_d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_b0,(internal *)&local_c8,
                           (AssertionResult *)
                           "GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2401,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_d0);
                testing::internal::AssertHelper::~AssertHelper(&local_48);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                  local_a0._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
                }
                if (local_c0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c0,local_c0);
                }
                uVar9 = 1;
                if (!bVar2) goto LAB_001de9ce;
              }
              testing::internal::
              CmpHelperEQ<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                        ((internal *)local_b0,"order1","order2",
                         (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                         &local_68);
              if (local_b0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_c8);
                pcVar8 = "";
                if (local_a8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar8 = (local_a8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2402,pcVar8);
                testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_d0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
              if (local_a8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a8,local_a8);
              }
              pSVar5 = (SSL_METHOD *)TLS_method();
              pSVar6 = (SSL_CTX *)SSL_CTX_new(pSVar5);
              _Var1._M_head_impl = local_90._M_head_impl;
              bVar2 = local_90._M_head_impl != (SSL_CTX *)0x0;
              local_90._M_head_impl = pSVar6;
              if (bVar2) {
                SSL_CTX_free((SSL_CTX *)_Var1._M_head_impl);
              }
              local_c8.data_._0_1_ = local_90._M_head_impl != (SSL_CTX *)0x0;
              local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_90._M_head_impl == (SSL_CTX *)0x0) {
                testing::Message::Message((Message *)&local_d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_b0,(internal *)&local_c8,(AssertionResult *)0x3442d9,
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2405,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_d0);
                testing::internal::AssertHelper::~AssertHelper(&local_48);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                  local_a0._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
                }
                if (local_c0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c0,local_c0);
                }
                uVar9 = 1;
              }
              else {
                SSL_CTX_set_permute_extensions(local_90._M_head_impl,1);
                bVar2 = GetExtensionOrder(local_90._M_head_impl,
                                          (vector<unsigned_short,_std::allocator<unsigned_short>_> *
                                          )local_88,ech_keys._M_head_impl,local_d1);
                local_c8.data_._0_1_ = bVar2;
                local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!bVar2) {
                  testing::Message::Message((Message *)&local_d0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_b0,(internal *)&local_c8,
                             (AssertionResult *)
                             "GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech)",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_48,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2412,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
                  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_48);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                    local_a0._M_allocated_capacity + 1);
                  }
                  if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))
                              ();
                  }
                  if (local_c0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c0,local_c0);
                  }
                  uVar9 = 1;
                  if (!bVar2) goto LAB_001de9ce;
                }
                local_c8.data_ = (AssertHelperData *)((long)pbStack_80 - (long)local_88 >> 1);
                local_d0.data_._0_4_ = 5;
                testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
                          ((internal *)local_b0,"order1.size()","5u",(unsigned_long *)&local_c8,
                           (uint *)&local_d0);
                if (local_b0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_c8);
                  pcVar8 = "";
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar8 = (local_a8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_d0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2413,pcVar8);
                  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
                  testing::internal::AssertHelper::~AssertHelper(&local_d0);
                  if (local_c8.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
                if (local_a8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_a8,local_a8);
                }
                iVar7 = 0xe;
                do {
                  bVar2 = GetExtensionOrder(local_90._M_head_impl,&local_68,ech_keys._M_head_impl,
                                            local_d1);
                  local_c8.data_._0_1_ = bVar2;
                  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (!bVar2) {
                    testing::Message::Message((Message *)&local_d0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_b0,(internal *)&local_c8,
                               (AssertionResult *)
                               "GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech)",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_48,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x2418,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
                    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_d0);
                    testing::internal::AssertHelper::~AssertHelper(&local_48);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                      local_a0._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0)
                    {
                      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8)
                      )();
                    }
                    if (local_c0 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_c0,local_c0);
                    }
                    if (!bVar2) {
                      uVar9 = 1;
                      cVar3 = '\0';
                      bVar2 = false;
                      goto LAB_001de8ea;
                    }
                  }
                  uVar9 = 6;
                  bVar2 = true;
                  if ((long)pbStack_80 - (long)local_88 !=
                      (long)local_68.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) {
                    cVar3 = '\x01';
                    goto LAB_001de8ea;
                  }
                  if (((undefined1  [8])pbStack_80 != local_88) &&
                     (iVar4 = bcmp((void *)local_88,
                                   local_68.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)pbStack_80 - (long)local_88), iVar4 != 0)) {
                    cVar3 = '\x01';
                    bVar2 = true;
                    goto LAB_001de8ea;
                  }
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
                cVar3 = '\0';
LAB_001de8ea:
                if (bVar2) {
                  local_c8.data_._0_1_ = cVar3;
                  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (cVar3 == '\0') {
                    testing::Message::Message((Message *)&local_d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               (CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 0x10),
                               "Extensions were not permuted",0x1c);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_b0,(internal *)&local_c8,(AssertionResult *)"passed",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_48,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x241e,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
                    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_d0);
                    testing::internal::AssertHelper::~AssertHelper(&local_48);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                      local_a0._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0)
                    {
                      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8)
                      )();
                    }
                  }
                  if (local_c0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c0,local_c0);
                  }
                  uVar9 = 0;
                }
              }
            }
            else {
              testing::Message::Message((Message *)&local_d0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_b0,(internal *)&local_c8,
                         (AssertionResult *)
                         "GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x23ff,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_d0);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                local_a0._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
              }
              if (local_c0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_c0,local_c0);
              }
              uVar9 = 1;
              if (bVar2) goto LAB_001de2ec;
            }
LAB_001de9ce:
            if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_68.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_88 != (undefined1  [8])0x0) {
              operator_delete((void *)local_88,(long)local_78 - (long)local_88);
            }
          }
          std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_90);
        }
        testing::ScopedTrace::~ScopedTrace(&local_b2);
        if ((uVar9 != 5) && (uVar9 != 0)) goto LAB_001dea34;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 2);
      uVar9 = 0;
LAB_001dea34:
      testing::ScopedTrace::~ScopedTrace(&local_b1);
    } while (((uVar9 & 3) == 0) && (lVar10 = local_38 + 1, lVar10 != 2));
  }
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(SSLTest, PermuteExtensions) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys();
  ASSERT_TRUE(keys);
  for (bool offer_ech : {false, true}) {
    SCOPED_TRACE(offer_ech);
    SSL_ECH_KEYS *maybe_keys = offer_ech ? keys.get() : nullptr;
    for (bool decrypt_ech : {false, true}) {
      SCOPED_TRACE(decrypt_ech);
      if (!offer_ech && decrypt_ech) {
        continue;
      }

      // When extension permutation is disabled, the order should be consistent.
      bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      std::vector<uint16_t> order1, order2;
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech));
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech));
      EXPECT_EQ(order1, order2);

      ctx.reset(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      SSL_CTX_set_permute_extensions(ctx.get(), 1);

      // When extension permutation is enabled, each ClientHello should have a
      // different order.
      //
      // This test is inherently flaky, so we run it multiple times. We send at
      // least five extensions by default from TLS 1.3: supported_versions,
      // key_share, supported_groups, psk_key_exchange_modes, and
      // signature_algorithms. That means the probability of a false negative is
      // at most 1/120. Repeating the test 14 times lowers false negative rate
      // to under 2^-96.
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech));
      EXPECT_GE(order1.size(), 5u);
      static const int kNumIterations = 14;
      bool passed = false;
      for (int i = 0; i < kNumIterations; i++) {
        ASSERT_TRUE(
            GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech));
        if (order1 != order2) {
          passed = true;
          break;
        }
      }
      EXPECT_TRUE(passed) << "Extensions were not permuted";
    }
  }
}